

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O3

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  float *pfVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  void *pvVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  
  iVar2 = bottom_blob->dims;
  iVar3 = bottom_blob->w;
  uVar4 = bottom_blob->h;
  uVar5 = bottom_blob->c;
  Mat::create_like(top_blob,bottom_blob,opt->blob_allocator);
  pvVar15 = top_blob->data;
  if (pvVar15 == (void *)0x0) {
    return -100;
  }
  sVar9 = top_blob->cstep;
  if ((long)top_blob->c * sVar9 == 0) {
    return -100;
  }
  if (iVar2 == 3) {
    if ((int)uVar5 < 1) {
      return 0;
    }
    pvVar14 = bottom_blob->data;
    sVar11 = bottom_blob->cstep;
    iVar2 = this->scale_data_size;
    iVar6 = this->bias_data_size;
    pfVar10 = (float *)(this->bias_data).data;
    sVar12 = bottom_blob->elemsize;
    sVar13 = top_blob->elemsize;
    uVar18 = 0;
    do {
      uVar19 = 0;
      if (iVar2 != 1) {
        uVar19 = uVar18 & 0xffffffff;
      }
      if (iVar6 == 0) {
        fVar20 = 0.0;
      }
      else {
        pfVar16 = pfVar10;
        if (iVar6 != 1) {
          pfVar16 = pfVar10 + uVar18;
        }
        fVar20 = *pfVar16;
      }
      if (0 < (int)(uVar4 * iVar3)) {
        fVar1 = *(float *)((long)(this->scale_data).data + uVar19 * 4);
        lVar17 = 0;
        do {
          *(float *)((long)pvVar15 + lVar17 * 4) =
               (float)*(int *)((long)pvVar14 + lVar17 * 4) * fVar1 + fVar20;
          lVar17 = lVar17 + 1;
        } while (uVar4 * iVar3 != (int)lVar17);
      }
      uVar18 = uVar18 + 1;
      pvVar14 = (void *)((long)pvVar14 + sVar11 * sVar12);
      pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar13);
    } while (uVar18 != uVar5);
  }
  else {
    if (iVar2 != 2) {
      if (iVar2 != 1) {
        return 0;
      }
      if (this->bias_data_size == 0) {
        fVar20 = 0.0;
      }
      else {
        fVar20 = *(this->bias_data).data;
      }
      if (iVar3 < 1) {
        return 0;
      }
      pvVar14 = bottom_blob->data;
      fVar1 = *(this->scale_data).data;
      lVar17 = 0;
      do {
        *(float *)((long)pvVar15 + lVar17 * 4) =
             (float)*(int *)((long)pvVar14 + lVar17 * 4) * fVar1 + fVar20;
        lVar17 = lVar17 + 1;
      } while (iVar3 != (int)lVar17);
      return 0;
    }
    if ((int)uVar4 < 1) {
      return 0;
    }
    pvVar14 = bottom_blob->data;
    iVar2 = bottom_blob->w;
    iVar6 = top_blob->w;
    iVar7 = this->scale_data_size;
    iVar8 = this->bias_data_size;
    sVar9 = bottom_blob->elemsize;
    pfVar10 = (float *)(this->bias_data).data;
    sVar11 = top_blob->elemsize;
    uVar18 = 0;
    do {
      uVar19 = 0;
      if (iVar7 != 1) {
        uVar19 = uVar18 & 0xffffffff;
      }
      if (iVar8 == 0) {
        fVar20 = 0.0;
      }
      else {
        pfVar16 = pfVar10;
        if (iVar8 != 1) {
          pfVar16 = pfVar10 + uVar18;
        }
        fVar20 = *pfVar16;
      }
      if (0 < iVar3) {
        fVar1 = *(float *)((long)(this->scale_data).data + uVar19 * 4);
        lVar17 = 0;
        do {
          *(float *)((long)pvVar15 + lVar17 * 4) =
               (float)*(int *)((long)pvVar14 + lVar17 * 4) * fVar1 + fVar20;
          lVar17 = lVar17 + 1;
        } while (iVar3 != (int)lVar17);
      }
      uVar18 = uVar18 + 1;
      pvVar14 = (void *)((long)pvVar14 + (long)iVar2 * sVar9);
      pvVar15 = (void *)((long)pvVar15 + (long)iVar6 * sVar11);
    } while (uVar18 != uVar4);
  }
  return 0;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        // assert scale_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        const float scale = scale_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];

        dequantize(intptr, ptr, scale, bias, w);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];

            dequantize(intptr, ptr, scale, bias, w);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];

            dequantize(intptr, ptr, scale, bias, w * h);
        }
    }

    return 0;
}